

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::MarkVectorShuffleUsesAsLive
          (VectorDCE *this,WorkListItem *current_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  IRContext *this_00;
  WorkListItem local_c0;
  WorkListItem local_a0;
  uint32_t local_80;
  uint local_7c;
  uint32_t index;
  uint32_t in_op;
  uint32_t size_of_second_operand;
  uint32_t size_of_first_operand;
  WorkListItem second_operand;
  WorkListItem first_operand;
  DefUseManager *def_use_mgr;
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  *work_list_local;
  LiveComponentMap *live_components_local;
  WorkListItem *current_item_local;
  VectorDCE *this_local;
  
  this_00 = Pass::context((Pass *)this);
  first_operand.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)IRContext::get_def_use_mgr(this_00);
  WorkListItem::WorkListItem
            ((WorkListItem *)
             &second_operand.components.bits_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar2 = first_operand.components.bits_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  uVar4 = opt::Instruction::GetSingleWordInOperand(current_item->instruction,0);
  second_operand.components.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)analysis::DefUseManager::GetDef((DefUseManager *)puVar2,uVar4);
  WorkListItem::WorkListItem((WorkListItem *)&size_of_second_operand);
  puVar2 = first_operand.components.bits_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  uVar4 = opt::Instruction::GetSingleWordInOperand(current_item->instruction,1);
  _size_of_second_operand = analysis::DefUseManager::GetDef((DefUseManager *)puVar2,uVar4);
  uVar4 = opt::Instruction::type_id
                    ((Instruction *)
                     second_operand.components.bits_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  in_op = GetVectorComponentCount(this,uVar4);
  uVar4 = opt::Instruction::type_id(_size_of_second_operand);
  index = GetVectorComponentCount(this,uVar4);
  for (local_7c = 2; uVar1 = local_7c,
      uVar4 = opt::Instruction::NumInOperands(current_item->instruction), uVar1 < uVar4;
      local_7c = local_7c + 1) {
    local_80 = opt::Instruction::GetSingleWordInOperand(current_item->instruction,local_7c);
    bVar3 = utils::BitVector::Get(&current_item->components,local_7c - 2);
    if (bVar3) {
      if (local_80 < in_op) {
        utils::BitVector::Set((BitVector *)&first_operand,local_80);
      }
      else if (local_80 - in_op < index) {
        utils::BitVector::Set((BitVector *)&second_operand,local_80 - in_op);
      }
    }
  }
  WorkListItem::WorkListItem
            (&local_a0,
             (WorkListItem *)
             &second_operand.components.bits_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  AddItemToWorkListIfNeeded(this,&local_a0,live_components,work_list);
  WorkListItem::~WorkListItem(&local_a0);
  WorkListItem::WorkListItem(&local_c0,(WorkListItem *)&size_of_second_operand);
  AddItemToWorkListIfNeeded(this,&local_c0,live_components,work_list);
  WorkListItem::~WorkListItem(&local_c0);
  WorkListItem::~WorkListItem((WorkListItem *)&size_of_second_operand);
  WorkListItem::~WorkListItem
            ((WorkListItem *)
             &second_operand.components.bits_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void VectorDCE::MarkVectorShuffleUsesAsLive(
    const WorkListItem& current_item,
    VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  WorkListItem first_operand;
  first_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(0));
  WorkListItem second_operand;
  second_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(1));

  uint32_t size_of_first_operand =
      GetVectorComponentCount(first_operand.instruction->type_id());
  uint32_t size_of_second_operand =
      GetVectorComponentCount(second_operand.instruction->type_id());

  for (uint32_t in_op = 2; in_op < current_item.instruction->NumInOperands();
       ++in_op) {
    uint32_t index = current_item.instruction->GetSingleWordInOperand(in_op);
    if (current_item.components.Get(in_op - 2)) {
      if (index < size_of_first_operand) {
        first_operand.components.Set(index);
      } else if (index - size_of_first_operand < size_of_second_operand) {
        second_operand.components.Set(index - size_of_first_operand);
      }
    }
  }

  AddItemToWorkListIfNeeded(first_operand, live_components, work_list);
  AddItemToWorkListIfNeeded(second_operand, live_components, work_list);
}